

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> this_00;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  string configFile;
  allocator<char> local_149;
  cmAlphaNum local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_100;
  pointer local_f8;
  undefined1 local_f0 [88];
  pointer pbStack_98;
  pointer local_90;
  pointer pbStack_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  bool local_60;
  PerConfig local_5c;
  bool local_58;
  string local_50;
  char *__s;
  
  local_f8 = (this->Makefiles).
             super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_100 = targets;
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmMakefile *)
                      (local_f8->_M_t).
                      super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t);
  local_f0._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_f0._0_8_ = psVar4->_M_string_length;
  local_148.View_._M_len = 0x12;
  local_148.View_._M_str = "/CPackConfig.cmake";
  cmStrCat<>(&local_50,(cmAlphaNum *)local_f0,&local_148);
  bVar2 = cmsys::SystemTools::FileExists(&local_50);
  if (bVar2) {
    lVar5 = 0;
    do {
      if (lVar5 == 0x10) {
        iVar3 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
        puVar1 = local_f8;
        __s = (char *)CONCAT44(extraout_var,iVar3);
        local_f0._0_8_ = local_f0 + 0x10;
        local_f0._8_8_ = (pointer)0x0;
        local_f0[0x10] = '\0';
        local_f0._32_8_ = local_f0 + 0x30;
        local_f0._40_8_ = 0;
        local_f0[0x30] = '\0';
        local_80._M_p = (pointer)&local_70;
        local_f0._64_8_ = (pointer)0x0;
        local_f0._72_8_ = (pointer)0x0;
        local_f0._80_8_ = (pointer)0x0;
        pbStack_98 = (pointer)0x0;
        local_90 = (pointer)0x0;
        pbStack_88 = (pointer)0x0;
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        local_60 = false;
        local_5c = Yes;
        local_58 = false;
        (*this->_vptr_cmGlobalGenerator[0x1f])(this);
        std::__cxx11::string::assign(local_f0);
        std::__cxx11::string::assign(local_f0 + 0x20);
        local_60 = true;
        cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                  ((cmMakefile *)
                   (puVar1->_M_t).
                   super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t);
        std::__cxx11::string::_M_assign((string *)&local_80);
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_118,psVar4);
        if (((__s != (char *)0x0) && (*__s != '\0')) && (*__s != '.')) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"-C",&local_149);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,__s,&local_149);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_148);
          std::__cxx11::string::~string((string *)&local_148);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"--config",&local_149);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"./CPackConfig.cmake",&local_149);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   (local_f0 + 0x40),(cmCustomCommandLine *)&local_118);
        iVar3 = (*this->_vptr_cmGlobalGenerator[0x1d])(this);
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          this_00._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
          super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
               (puVar1->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
               _M_t;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY",&local_149);
          cmMakefile::GetDefinition
                    ((cmMakefile *)
                     this_00._M_t.
                     super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                     super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(string *)&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          bVar2 = cmIsOff((cmValue)0x30329c);
          if (bVar2) {
            iVar3 = (*this->_vptr_cmGlobalGenerator[0x19])(this);
            local_148.View_._M_len = CONCAT44(extraout_var_02,iVar3);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pbStack_98,(char **)&local_148);
          }
        }
        else {
          iVar3 = (*this->_vptr_cmGlobalGenerator[0x1d])(this);
          local_148.View_._M_len = CONCAT44(extraout_var_01,iVar3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pbStack_98,(char **)&local_148);
        }
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(local_100,(GlobalTargetInfo *)local_f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_118);
        GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_f0);
        break;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f0,
                 *(char **)((long)&AddGlobalTarget_Package(std::vector<cmGlobalGenerator::GlobalTargetInfo,std::allocator<cmGlobalGenerator::GlobalTargetInfo>>&)
                                   ::reservedTargets + lVar5),(allocator<char> *)&local_118);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"when CPack packaging is enabled",&local_149);
      bVar2 = CheckCMP0037(this,(string *)local_f0,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)local_f0);
      lVar5 = lVar5 + 8;
    } while (bVar2);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  std::string configFile =
    cmStrCat(mf->GetCurrentBinaryDirectory(), "/CPackConfig.cmake");
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package", "PACKAGE" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CPack packaging is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  singleLine.push_back("./CPackConfig.cmake");
  gti.CommandLines.push_back(std::move(singleLine));
  if (this->GetPreinstallTargetName()) {
    gti.Depends.emplace_back(this->GetPreinstallTargetName());
  } else {
    cmValue noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (cmIsOff(noPackageAll)) {
      gti.Depends.emplace_back(this->GetAllTargetName());
    }
  }
  targets.push_back(std::move(gti));
}